

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote.cpp
# Opt level: O1

MapModuleMemoryRegion * __thiscall remote::Handle::GetRegionOfAddress(Handle *this,void *address)

{
  MapModuleMemoryRegion *pMVar1;
  long lVar2;
  
  pMVar1 = (this->regions).
           super__Vector_base<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->regions).
                super__Vector_base<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1;
  if (lVar2 != 0) {
    lVar2 = (lVar2 >> 3) * -0x1111111111111111;
    lVar2 = lVar2 + (ulong)(lVar2 == 0);
    do {
      if ((address < (void *)pMVar1->start) &&
         ((void *)((long)pMVar1->start + pMVar1->end) <= address)) {
        return pMVar1;
      }
      pMVar1 = pMVar1 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return (MapModuleMemoryRegion *)0x0;
}

Assistant:

MapModuleMemoryRegion* Handle::GetRegionOfAddress(void* address) {
        for(size_t i = 0; i < regions.size(); i++) {
            if(regions[i].start > (unsigned long) address && (regions[i].start + regions[i].end) <= (unsigned long) address) {
                return &regions[i];
            }
        }

        return NULL;
    }